

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

Result * __thiscall
diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::resolve
          (Result *__return_storage_ptr__,ShaderSubgroupSupportHelper *this)

{
  Feature *pFVar1;
  __node_base *p_Var2;
  long lVar3;
  Feature feature;
  long lVar4;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  unique_candidates;
  CandidateVector candidates;
  FeatureVector deps;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_120;
  CandidateVector local_e8;
  FeatureVector local_a8;
  CandidateVector local_70;
  
  Result::Result(__return_storage_ptr__);
  feature = SubgroupMask;
  while( true ) {
    if (feature == FeatureCount) break;
    if ((this->feature_mask >> (feature & (FeatureCount|SubgroupID)) & 1) != 0) {
      local_120._M_buckets = &local_120._M_single_bucket;
      local_120._M_bucket_count = 1;
      local_120._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_120._M_element_count = 0;
      local_120._M_rehash_policy._M_max_load_factor = 1.0;
      local_120._M_rehash_policy._M_next_resize = 0;
      local_120._M_single_bucket = (__node_base_ptr)0x0;
      get_candidates_for_feature(&local_e8,feature);
      ::std::__detail::
      _Insert_base<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::insert<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate*>
                ((_Insert_base<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&local_120,
                 local_e8.
                 super_VectorView<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
                 .ptr,local_e8.
                      super_VectorView<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
                      .ptr + local_e8.
                             super_VectorView<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
                             .buffer_size);
      get_feature_dependencies(&local_a8,feature);
      pFVar1 = local_a8.
               super_VectorView<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>
               .ptr;
      lVar4 = local_a8.
              super_VectorView<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>
              .buffer_size << 2;
      for (lVar3 = 0; lVar4 != lVar3; lVar3 = lVar3 + 4) {
        get_candidates_for_feature(&local_70,*(Feature *)((long)pFVar1 + lVar3));
        SmallVector<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>
        ::operator=(&local_e8,&local_70);
        SmallVector<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>
        ::~SmallVector(&local_70);
        if (local_e8.
            super_VectorView<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
            .buffer_size != 0) {
          ::std::__detail::
          _Insert_base<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::insert<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate*>
                    ((_Insert_base<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)&local_120,
                     local_e8.
                     super_VectorView<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
                     .ptr,local_e8.
                          super_VectorView<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
                          .ptr + local_e8.
                                 super_VectorView<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
                                 .buffer_size);
        }
      }
      p_Var2 = &local_120._M_before_begin;
      while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
        __return_storage_ptr__->weights[(uint)*(size_type *)(p_Var2 + 1)] =
             __return_storage_ptr__->weights[(uint)*(size_type *)(p_Var2 + 1)] + 1;
      }
      SmallVector<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature,_8UL>::
      ~SmallVector(&local_a8);
      SmallVector<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>
      ::~SmallVector(&local_e8);
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_120);
    }
    feature = feature + SubgroupSize;
  }
  return __return_storage_ptr__;
}

Assistant:

CompilerGLSL::ShaderSubgroupSupportHelper::Result CompilerGLSL::ShaderSubgroupSupportHelper::resolve() const
{
	Result res;

	for (uint32_t i = 0u; i < FeatureCount; ++i)
	{
		if (feature_mask & (1u << i))
		{
			auto feature = static_cast<Feature>(i);
			std::unordered_set<uint32_t> unique_candidates;

			auto candidates = get_candidates_for_feature(feature);
			unique_candidates.insert(candidates.begin(), candidates.end());

			auto deps = get_feature_dependencies(feature);
			for (Feature d : deps)
			{
				candidates = get_candidates_for_feature(d);
				if (!candidates.empty())
					unique_candidates.insert(candidates.begin(), candidates.end());
			}

			for (uint32_t c : unique_candidates)
				++res.weights[static_cast<Candidate>(c)];
		}
	}

	return res;
}